

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  ulong max_backward_limit;
  uint32_t *puVar1;
  HasherCommon *pHVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  size_t pos;
  long lVar12;
  uint8_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint8_t *puVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  BackwardMatch *pBVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ZopfliNode *nodes_00;
  long local_19d8;
  ulong local_19d0;
  ulong local_19a8;
  ulong local_1988;
  ulong local_1978;
  uint32_t local_1908 [40];
  StartPosQueue queue;
  ZopfliCostModel model;
  BackwardMatch matches [384];
  
  iVar4 = params->lgwin;
  uVar9 = 0x145;
  if (params->quality < 0xb) {
    uVar9 = 0x96;
  }
  lVar21 = 0;
  if (0x7e < num_bytes) {
    lVar21 = num_bytes - 0x7f;
  }
  sVar8 = params->stream_offset;
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (3 < num_bytes) {
    max_backward_limit = (1L << ((byte)iVar4 & 0x3f)) - 0x10;
    pos = 0;
    do {
      uVar19 = pos + position;
      uVar23 = max_backward_limit;
      if (uVar19 < max_backward_limit) {
        uVar23 = uVar19;
      }
      uVar10 = sVar8 + uVar19;
      if (max_backward_limit <= uVar10) {
        uVar10 = max_backward_limit;
      }
      uVar15 = num_bytes - pos;
      uVar22 = uVar19 & ringbuffer_mask;
      uVar5 = 0x10;
      if (params->quality == 0xb) {
        uVar5 = 0x40;
      }
      uVar7 = 0;
      if (uVar5 <= uVar19) {
        uVar7 = uVar19 - uVar5;
      }
      puVar13 = ringbuffer + uVar22;
      uVar14 = (ulong)((uint)uVar15 & 7);
      uVar29 = 1;
      pBVar24 = matches;
      uVar5 = uVar19;
      do {
        uVar5 = uVar5 - 1;
        if ((uVar5 <= uVar7) || (2 < uVar29)) break;
        uVar25 = uVar19 - uVar5;
        if ((uVar25 <= uVar23) &&
           ((uVar27 = uVar5 & ringbuffer_mask, *puVar13 == ringbuffer[uVar27] &&
            (puVar13[1] == ringbuffer[uVar27 + 1])))) {
          if (7 < uVar15) {
            lVar16 = 0;
            uVar30 = 0;
LAB_00121453:
            if (*(ulong *)(puVar13 + uVar30 * 8) == *(ulong *)(ringbuffer + uVar30 * 8 + uVar27))
            goto code_r0x00121460;
            uVar30 = *(ulong *)(ringbuffer + uVar30 * 8 + uVar27) ^ *(ulong *)(puVar13 + uVar30 * 8)
            ;
            uVar27 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            uVar30 = (uVar27 >> 3 & 0x1fffffff) - lVar16;
            goto LAB_001214ad;
          }
          puVar17 = puVar13;
          uVar31 = 0;
LAB_001214da:
          uVar30 = uVar31;
          if (uVar14 != 0) {
            uVar28 = uVar14 | uVar31;
            uVar20 = uVar14;
            do {
              uVar30 = uVar31;
              if (ringbuffer[uVar31 + uVar27] != *puVar17) break;
              puVar17 = puVar17 + 1;
              uVar31 = uVar31 + 1;
              uVar20 = uVar20 - 1;
              uVar30 = uVar28;
            } while (uVar20 != 0);
          }
LAB_001214ad:
          if (uVar29 < uVar30) {
            pBVar24->distance = (uint32_t)uVar25;
            pBVar24->length_and_code = (int)uVar30 << 5;
            pBVar24 = pBVar24 + 1;
            uVar29 = uVar30;
          }
        }
      } while (uVar25 <= uVar23);
      if (uVar29 < uVar15) {
        uVar11 = (uint)(*(int *)(ringbuffer + uVar22) * 0x1e35a7bd) >> 0xf;
        uVar5 = (hasher->privat)._H5.bucket_size_;
        puVar1 = (hasher->privat)._H2.buckets_;
        pHVar2 = (hasher->privat)._H40.common;
        uVar14 = (ulong)puVar1[uVar11];
        uVar7 = uVar15;
        if (0x7f < uVar15) {
          puVar1[uVar11] = (uint32_t)uVar19;
          uVar7 = 0x80;
        }
        local_19d8 = (uVar5 & uVar19) * 2 + 1;
        lVar16 = (uVar5 & uVar19) * 2;
        lVar26 = 0x40;
        local_1988 = 0;
        local_1978 = 0;
LAB_001215a7:
        uVar25 = uVar19 - uVar14;
        if ((uVar25 != 0) && (lVar26 != 0 && uVar25 <= uVar23)) {
          uVar27 = local_1978;
          if (local_1988 < local_1978) {
            uVar27 = local_1988;
          }
          puVar13 = ringbuffer + uVar27 + (uVar14 & ringbuffer_mask);
          uVar30 = uVar15 - uVar27;
          if (7 < uVar30) {
            uVar20 = uVar30 & 0xfffffffffffffff8;
            lVar12 = 0;
            uVar31 = 0;
LAB_00121645:
            if (*(ulong *)(puVar13 + uVar31 * 8) ==
                *(ulong *)(ringbuffer + uVar31 * 8 + uVar27 + uVar22)) goto code_r0x00121654;
            uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar27 + uVar22) ^
                     *(ulong *)(puVar13 + uVar31 * 8);
            uVar30 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar31 = (uVar30 >> 3 & 0x1fffffff) - lVar12;
            goto LAB_001216a0;
          }
          uVar20 = 0;
          goto LAB_0012178a;
        }
        if (0x7f < uVar15) {
          *(int *)((long)&pHVar2->extra + lVar16 * 4) = (hasher->privat)._H5.hash_shift_;
          iVar4 = (hasher->privat)._H5.hash_shift_;
          goto LAB_001215d5;
        }
        goto LAB_001215dc;
      }
LAB_001217be:
      lVar16 = 0;
      do {
        local_1908[lVar16] = 0xfffffff;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x26);
      uVar29 = uVar29 + 1;
      if (uVar29 < 5) {
        uVar29 = 4;
      }
      nodes_00 = (ZopfliNode *)0x12180d;
      iVar4 = BrotliFindAllStaticDictionaryMatches
                        (&params->dictionary,ringbuffer + uVar22,uVar29,uVar15,local_1908);
      if (iVar4 != 0) {
        if (0x24 < uVar15) {
          uVar15 = 0x25;
        }
        if (uVar29 <= uVar15) {
          iVar4 = (int)uVar29 << 5;
          do {
            uVar11 = local_1908[uVar29];
            if ((uVar11 < 0xfffffff) &&
               (uVar23 = (ulong)(uVar11 >> 5) + uVar10 + 1, uVar23 <= (params->dist).max_distance))
            {
              uVar11 = uVar11 & 0x1f;
              pBVar24->distance = (uint32_t)uVar23;
              if (uVar29 == uVar11) {
                uVar11 = 0;
              }
              pBVar24->length_and_code = uVar11 + iVar4;
              pBVar24 = pBVar24 + 1;
            }
            uVar29 = uVar29 + 1;
            iVar4 = iVar4 + 0x20;
          } while (uVar15 + 1 != uVar29);
        }
      }
      if ((long)pBVar24 - (long)matches == 0) {
        sVar18 = 0;
      }
      else {
        sVar18 = (long)pBVar24 - (long)matches >> 3;
        if (uVar9 < pBVar24[-1].length_and_code >> 5) {
          matches[0] = matches[sVar18 - 1];
          sVar18 = 1;
        }
      }
      sVar6 = UpdateNodes(num_bytes,position,pos,ringbuffer,ringbuffer_mask,params,
                          max_backward_limit,dist_cache,sVar18,matches,&model,&queue,nodes);
      uVar23 = 0;
      if (0x3fff < sVar6) {
        uVar23 = sVar6;
      }
      if (sVar18 == 1) {
        uVar11 = matches[0].length_and_code >> 5;
        if ((uVar9 < uVar11) && (uVar23 < uVar11)) {
          uVar23 = (ulong)uVar11;
        }
      }
      sVar18 = pos;
      if (1 < uVar23) {
        uVar10 = uVar19 + 1;
        uVar5 = uVar23 + uVar19;
        if (lVar21 + position <= uVar23 + uVar19) {
          uVar5 = lVar21 + position;
        }
        uVar15 = uVar5 - 0x3f;
        if (uVar5 < uVar19 + 0x40) {
          uVar15 = uVar10;
        }
        if ((uVar19 + 0x201 <= uVar15) && (uVar10 < uVar15)) {
          uVar19 = (hasher->privat)._H5.bucket_size_;
          puVar1 = (hasher->privat)._H2.buckets_;
          pHVar2 = (hasher->privat)._H40.common;
LAB_00121a16:
          uVar29 = uVar10 & ringbuffer_mask;
          uVar11 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0xf;
          uVar14 = (ulong)puVar1[uVar11];
          uVar22 = (uVar19 & uVar10) * 2 + 1;
          uVar7 = (uVar19 & uVar10) * 2;
          puVar1[uVar11] = (uint32_t)uVar10;
          lVar16 = 0x40;
          local_19d0 = 0;
          local_19a8 = 0;
LAB_00121a6a:
          if ((uVar10 != uVar14) && (lVar16 != 0 && uVar10 - uVar14 <= uVar19 - 0xf)) {
            uVar25 = local_19a8;
            if (local_19d0 < local_19a8) {
              uVar25 = local_19d0;
            }
            puVar13 = ringbuffer + uVar25 + (uVar14 & ringbuffer_mask);
            uVar27 = 0x80 - uVar25;
            if (7 < uVar27) {
              uVar30 = uVar27 & 0xfffffffffffffff8;
              lVar26 = 0;
              uVar31 = 0;
LAB_00121af9:
              if (*(ulong *)(puVar13 + uVar31 * 8) ==
                  *(ulong *)(ringbuffer + uVar31 * 8 + uVar25 + uVar29)) goto code_r0x00121b06;
              uVar30 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar25 + uVar29) ^
                       *(ulong *)(puVar13 + uVar31 * 8);
              uVar27 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar31 = (uVar27 >> 3 & 0x1fffffff) - lVar26;
              goto LAB_00121b53;
            }
            uVar30 = 0;
            goto LAB_00121bd1;
          }
          iVar4 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)&pHVar2->extra + uVar7 * 4) = iVar4;
          *(int *)((long)&pHVar2->extra + uVar22 * 4) = iVar4;
          bVar3 = false;
          goto LAB_00121a92;
        }
LAB_00121c13:
        if (uVar15 < uVar5) {
          uVar19 = (hasher->privat)._H5.bucket_size_;
          puVar1 = (hasher->privat)._H2.buckets_;
          pHVar2 = (hasher->privat)._H40.common;
LAB_00121c38:
          uVar7 = uVar15 & ringbuffer_mask;
          uVar11 = (uint)(*(int *)(ringbuffer + uVar7) * 0x1e35a7bd) >> 0xf;
          uVar29 = (ulong)puVar1[uVar11];
          uVar10 = (uVar19 & uVar15) * 2 + 1;
          uVar22 = (uVar19 & uVar15) * 2;
          puVar1[uVar11] = (uint32_t)uVar15;
          lVar16 = 0x40;
          local_19d0 = 0;
          local_19a8 = 0;
LAB_00121c91:
          if ((uVar15 != uVar29) && (lVar16 != 0 && uVar15 - uVar29 <= uVar19 - 0xf)) {
            uVar14 = local_19a8;
            if (local_19d0 < local_19a8) {
              uVar14 = local_19d0;
            }
            puVar13 = ringbuffer + uVar14 + (uVar29 & ringbuffer_mask);
            uVar25 = 0x80 - uVar14;
            if (7 < uVar25) {
              uVar30 = uVar25 & 0xfffffffffffffff8;
              lVar26 = 0;
              uVar27 = 0;
LAB_00121d1f:
              if (*(ulong *)(puVar13 + uVar27 * 8) ==
                  *(ulong *)(ringbuffer + uVar27 * 8 + uVar14 + uVar7)) goto code_r0x00121d2c;
              uVar27 = *(ulong *)(ringbuffer + uVar27 * 8 + uVar14 + uVar7) ^
                       *(ulong *)(puVar13 + uVar27 * 8);
              uVar25 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar27 = (uVar25 >> 3 & 0x1fffffff) - lVar26;
              goto LAB_00121d76;
            }
            uVar30 = 0;
            goto LAB_00121dfc;
          }
          iVar4 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)&pHVar2->extra + uVar22 * 4) = iVar4;
          *(int *)((long)&pHVar2->extra + uVar10 * 4) = iVar4;
          bVar3 = false;
          goto LAB_00121cb9;
        }
LAB_00121e39:
        lVar16 = uVar23 - 1;
        if (lVar16 != 0) {
          uVar19 = pos + 4;
          do {
            sVar18 = uVar19 - 3;
            if (num_bytes <= uVar19) break;
            EvaluateNode(position + sVar8,sVar18,max_backward_limit,(size_t)dist_cache,(int *)&model
                         ,(ZopfliCostModel *)&queue,(StartPosQueue *)nodes,nodes_00);
            uVar19 = uVar19 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
      }
      pos = sVar18 + 1;
    } while (sVar18 + 4 < num_bytes);
  }
  BrotliFree(m,model.literal_costs_);
  model.literal_costs_ = (float *)0x0;
  BrotliFree(m,model.cost_dist_);
  model.cost_dist_ = (float *)0x0;
  sVar8 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar8;
code_r0x00121460:
  uVar30 = uVar30 + 1;
  lVar16 = lVar16 + -8;
  puVar17 = puVar13 + (uVar15 & 0xfffffffffffffff8);
  uVar31 = uVar15 & 0xfffffffffffffff8;
  if (uVar15 >> 3 == uVar30) goto LAB_001214da;
  goto LAB_00121453;
code_r0x00121654:
  uVar31 = uVar31 + 1;
  lVar12 = lVar12 + -8;
  if (uVar30 >> 3 == uVar31) goto code_r0x00121660;
  goto LAB_00121645;
code_r0x00121660:
  puVar13 = puVar13 + -lVar12;
LAB_0012178a:
  uVar30 = uVar30 & 7;
  uVar31 = uVar20;
  if (uVar30 != 0) {
    uVar28 = uVar20 | uVar30;
    do {
      uVar31 = uVar20;
      if (ringbuffer[uVar20 + uVar27 + uVar22] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar20 = uVar20 + 1;
      uVar30 = uVar30 - 1;
      uVar31 = uVar28;
    } while (uVar30 != 0);
  }
LAB_001216a0:
  uVar31 = uVar31 + uVar27;
  if (pBVar24 == (BackwardMatch *)0x0) {
    pBVar24 = (BackwardMatch *)0x0;
  }
  else if (uVar29 < uVar31) {
    pBVar24->distance = (uint32_t)uVar25;
    pBVar24->length_and_code = (int)uVar31 << 5;
    pBVar24 = pBVar24 + 1;
    uVar29 = uVar31;
  }
  if (uVar31 < uVar7) {
    if (ringbuffer[uVar31 + (uVar14 & ringbuffer_mask)] < ringbuffer[uVar31 + uVar22]) {
      if (0x7f < uVar15) {
        *(int *)((long)&pHVar2->extra + lVar16 * 4) = (int)uVar14;
      }
      lVar12 = (uVar14 & uVar5) * 2 + 1;
      lVar16 = lVar12;
      local_1988 = uVar31;
    }
    else {
      if (0x7f < uVar15) {
        *(int *)((long)&pHVar2->extra + local_19d8 * 4) = (int)uVar14;
      }
      lVar12 = (uVar14 & uVar5) * 2;
      local_19d8 = lVar12;
      local_1978 = uVar31;
    }
    uVar14 = (ulong)*(uint *)((long)&pHVar2->extra + lVar12 * 4);
    bVar3 = true;
  }
  else if (uVar15 < 0x80) {
    bVar3 = false;
  }
  else {
    *(undefined4 *)((long)&pHVar2->extra + lVar16 * 4) =
         *(undefined4 *)(&pHVar2->extra + (uVar14 & uVar5));
    iVar4 = *(int *)((long)&pHVar2->extra + (uVar14 & uVar5) * 8 + 4);
LAB_001215d5:
    *(int *)((long)&pHVar2->extra + local_19d8 * 4) = iVar4;
LAB_001215dc:
    bVar3 = false;
  }
  lVar26 = lVar26 + -1;
  if (!bVar3) goto LAB_001217be;
  goto LAB_001215a7;
code_r0x00121b06:
  uVar31 = uVar31 + 1;
  lVar26 = lVar26 + -8;
  if (uVar27 >> 3 == uVar31) goto code_r0x00121b12;
  goto LAB_00121af9;
code_r0x00121b12:
  puVar13 = puVar13 + -lVar26;
LAB_00121bd1:
  uVar27 = uVar27 & 7;
  uVar31 = uVar30;
  if (uVar27 != 0) {
    uVar20 = uVar30 | uVar27;
    do {
      uVar31 = uVar30;
      if (ringbuffer[uVar30 + uVar25 + uVar29] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar30 = uVar30 + 1;
      uVar27 = uVar27 - 1;
      uVar31 = uVar20;
    } while (uVar27 != 0);
  }
LAB_00121b53:
  uVar31 = uVar31 + uVar25;
  if (uVar31 < 0x80) {
    uVar25 = (uVar14 & uVar19) * 2;
    if (ringbuffer[uVar31 + (uVar14 & ringbuffer_mask)] < ringbuffer[uVar31 + uVar29]) {
      *(int *)((long)&pHVar2->extra + uVar7 * 4) = (int)uVar14;
      uVar7 = uVar25 | 1;
      uVar25 = uVar7;
      local_19d0 = uVar31;
    }
    else {
      *(int *)((long)&pHVar2->extra + uVar22 * 4) = (int)uVar14;
      uVar22 = uVar25;
      local_19a8 = uVar31;
    }
    uVar14 = (ulong)*(uint *)((long)&pHVar2->extra + uVar25 * 4);
    bVar3 = true;
  }
  else {
    *(undefined4 *)((long)&pHVar2->extra + uVar7 * 4) =
         *(undefined4 *)(&pHVar2->extra + (uVar14 & uVar19));
    *(undefined4 *)((long)&pHVar2->extra + uVar22 * 4) =
         *(undefined4 *)((long)&pHVar2->extra + (uVar14 & uVar19) * 8 + 4);
    bVar3 = false;
  }
LAB_00121a92:
  lVar16 = lVar16 + -1;
  if (!bVar3) goto LAB_00121c01;
  goto LAB_00121a6a;
LAB_00121c01:
  uVar10 = uVar10 + 8;
  if (uVar15 <= uVar10) goto LAB_00121c13;
  goto LAB_00121a16;
code_r0x00121d2c:
  uVar27 = uVar27 + 1;
  lVar26 = lVar26 + -8;
  if (uVar25 >> 3 == uVar27) goto code_r0x00121d38;
  goto LAB_00121d1f;
code_r0x00121d38:
  puVar13 = puVar13 + -lVar26;
LAB_00121dfc:
  uVar25 = uVar25 & 7;
  uVar27 = uVar30;
  if (uVar25 != 0) {
    uVar31 = uVar30 | uVar25;
    do {
      uVar27 = uVar30;
      if (ringbuffer[uVar30 + uVar14 + uVar7] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar30 = uVar30 + 1;
      uVar25 = uVar25 - 1;
      uVar27 = uVar31;
    } while (uVar25 != 0);
  }
LAB_00121d76:
  uVar27 = uVar27 + uVar14;
  if (uVar27 < 0x80) {
    uVar14 = (uVar29 & uVar19) * 2;
    if (ringbuffer[uVar27 + (uVar29 & ringbuffer_mask)] < ringbuffer[uVar27 + uVar7]) {
      *(int *)((long)&pHVar2->extra + uVar22 * 4) = (int)uVar29;
      uVar14 = uVar14 | 1;
      uVar22 = uVar14;
      local_19d0 = uVar27;
    }
    else {
      *(int *)((long)&pHVar2->extra + uVar10 * 4) = (int)uVar29;
      uVar10 = uVar14;
      local_19a8 = uVar27;
    }
    uVar29 = (ulong)*(uint *)((long)&pHVar2->extra + uVar14 * 4);
    bVar3 = true;
  }
  else {
    *(undefined4 *)((long)&pHVar2->extra + uVar22 * 4) =
         *(undefined4 *)(&pHVar2->extra + (uVar29 & uVar19));
    *(undefined4 *)((long)&pHVar2->extra + uVar10 * 4) =
         *(undefined4 *)((long)&pHVar2->extra + (uVar29 & uVar19) * 8 + 4);
    bVar3 = false;
  }
LAB_00121cb9:
  lVar16 = lVar16 + -1;
  if (!bVar3) goto LAB_00121e2b;
  goto LAB_00121c91;
LAB_00121e2b:
  uVar15 = uVar15 + 1;
  if (uVar5 <= uVar15) goto LAB_00121e39;
  goto LAB_00121c38;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  BROTLI_UNUSED(literal_context_lut);
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}